

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSharedDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  FileDescriptor *file;
  long lVar1;
  FieldGenerator *pFVar2;
  Descriptor *pDVar3;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *field;
  long lVar4;
  long lVar5;
  string local_70;
  string local_50;
  
  io::Printer::Print(printer,"void $classname$::SharedDtor() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  pDVar3 = this->descriptor_;
  if (0 < *(int *)(pDVar3 + 0x2c)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pFVar2 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar3 + 0x30) + lVar4));
      (*pFVar2->_vptr_FieldGenerator[10])(pFVar2,printer);
      lVar5 = lVar5 + 1;
      pDVar3 = this->descriptor_;
      lVar4 = lVar4 + 0x78;
    } while (lVar5 < *(int *)(pDVar3 + 0x2c));
  }
  file = *(FileDescriptor **)(pDVar3 + 0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  PrintHandlingOptionalStaticInitializers
            (file,printer,"if (this != default_instance_) {\n",
             "if (this != &default_instance()) {\n",(char *)0x0,&local_70,(char *)0x0,&local_50);
  field = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    field = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    field = extraout_RDX_01;
  }
  pDVar3 = this->descriptor_;
  if (0 < *(int *)(pDVar3 + 0x2c)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(pDVar3 + 0x30);
      if ((*(int *)(lVar1 + 0x30 + lVar4) != 3) &&
         (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar1 + 0x2c + lVar4) * 4)
          == 10)) {
        FieldName_abi_cxx11_(&local_70,(cxx *)(lVar1 + lVar4),field);
        io::Printer::Print(printer,"  delete $name$_;\n","name",&local_70);
        field = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          field = extraout_RDX_03;
        }
      }
      lVar5 = lVar5 + 1;
      pDVar3 = this->descriptor_;
      lVar4 = lVar4 + 0x78;
    } while (lVar5 < *(int *)(pDVar3 + 0x2c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSharedDestructorCode(io::Printer* printer) {
  printer->Print(
    "void $classname$::SharedDtor() {\n",
    "classname", classname_);
  printer->Indent();
  // Write the destructors for each field.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateDestructorCode(printer);
  }

  PrintHandlingOptionalStaticInitializers(
    descriptor_->file(), printer,
    // With static initializers.
    "if (this != default_instance_) {\n",
    // Without.
    "if (this != &default_instance()) {\n");

  // We need to delete all embedded messages.
  // TODO(kenton):  If we make unset messages point at default instances
  //   instead of NULL, then it would make sense to move this code into
  //   MessageFieldGenerator::GenerateDestructorCode().
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print("  delete $name$_;\n",
                     "name", FieldName(field));
    }
  }

  printer->Outdent();
  printer->Print(
    "  }\n"
    "}\n"
    "\n");
}